

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O2

void intgemm::kernel_upcast16to32_test<(intgemm::CPUType)4>(void)

{
  short sVar1;
  long lVar2;
  ulong uVar3;
  AlignedVector<int> output;
  AlignedVector<short> input;
  AssertionHandler catchAssertionHandler;
  dvector_t<(intgemm::CPUType)4,_int> result;
  int local_1fc [3];
  AlignedVector<int> local_1f0;
  AlignedVector<short> local_1e0;
  SourceLineInfo local_1d0;
  StringRef local_1c0;
  BinaryExpr<const_int_&,_const_int_&> local_1b0;
  AssertionHandler local_180;
  dvector_t<(intgemm::CPUType)4,_int> local_100;
  
  if (3 < kCPU) {
    AlignedVector<short>::AlignedVector(&local_1e0,0x20,0x40);
    AlignedVector<int>::AlignedVector(&local_1f0,0x20,0x40);
    sVar1 = -0x10;
    for (lVar2 = 0; local_1e0.size_ * 2 != lVar2; lVar2 = lVar2 + 2) {
      *(short *)((long)(longlong *)local_1e0.mem_ + lVar2) = sVar1;
      sVar1 = sVar1 + 1;
    }
    local_180.m_assertionInfo.macroName.m_start = (char *)*(longlong *)local_1e0.mem_;
    local_180.m_assertionInfo.macroName.m_size = ((longlong *)local_1e0.mem_)[1];
    local_180.m_assertionInfo.lineInfo.file = (char *)((longlong *)local_1e0.mem_)[2];
    local_180.m_assertionInfo.lineInfo.line = ((longlong *)local_1e0.mem_)[3];
    local_180.m_assertionInfo.capturedExpression.m_start = (char *)((longlong *)local_1e0.mem_)[4];
    local_180.m_assertionInfo.capturedExpression.m_size = ((longlong *)local_1e0.mem_)[5];
    local_180.m_assertionInfo._48_8_ = ((longlong *)local_1e0.mem_)[6];
    local_180._56_8_ = ((longlong *)local_1e0.mem_)[7];
    kernels::upcast16to32(&local_100,*(vector_t<CPUType::AVX512BW,_int> *)local_1e0.mem_);
    *(longlong *)local_1f0.mem_ = local_100.first[0];
    *(longlong *)((long)local_1f0.mem_ + 8) = local_100.first[1];
    *(longlong *)((long)local_1f0.mem_ + 0x10) = local_100.first[2];
    *(longlong *)((long)local_1f0.mem_ + 0x18) = local_100.first[3];
    *(longlong *)((long)local_1f0.mem_ + 0x20) = local_100.first[4];
    *(longlong *)((long)local_1f0.mem_ + 0x28) = local_100.first[5];
    *(longlong *)((long)local_1f0.mem_ + 0x30) = local_100.first[6];
    *(longlong *)((long)local_1f0.mem_ + 0x38) = local_100.first[7];
    *(longlong *)((long)local_1f0.mem_ + 0x40) = local_100.second[0];
    *(longlong *)((long)local_1f0.mem_ + 0x48) = local_100.second[1];
    *(longlong *)((long)local_1f0.mem_ + 0x50) = local_100.second[2];
    *(longlong *)((long)local_1f0.mem_ + 0x58) = local_100.second[3];
    *(longlong *)((long)local_1f0.mem_ + 0x60) = local_100.second[4];
    *(longlong *)((long)local_1f0.mem_ + 0x68) = local_100.second[5];
    *(longlong *)((long)local_1f0.mem_ + 0x70) = local_100.second[6];
    *(longlong *)((long)local_1f0.mem_ + 0x78) = local_100.second[7];
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < local_1f0.size_; uVar3 = uVar3 + 1) {
      local_1b0.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x18fab9;
      local_1b0.super_ITransientExpression.m_isBinaryExpression = true;
      local_1b0.super_ITransientExpression.m_result = false;
      local_1b0.super_ITransientExpression._10_6_ = 0;
      local_1d0.file =
           "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
      ;
      local_1d0.line = 0x40;
      Catch::StringRef::StringRef(&local_1c0,"output[i] == int32_t(input[i])");
      Catch::AssertionHandler::AssertionHandler
                (&local_180,(StringRef *)&local_1b0,&local_1d0,local_1c0,ContinueOnFailure);
      local_1d0.file = (char *)((long)local_1f0.mem_ + lVar2);
      local_1fc[0] = (int)*(short *)((long)(longlong *)local_1e0.mem_ + uVar3 * 2);
      Catch::ExprLhs<int_const&>::operator==(&local_1b0,(ExprLhs<int_const&> *)&local_1d0,local_1fc)
      ;
      Catch::AssertionHandler::handleExpr(&local_180,&local_1b0.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_1b0.super_ITransientExpression);
      Catch::AssertionHandler::complete(&local_180);
      Catch::AssertionHandler::~AssertionHandler(&local_180);
      lVar2 = lVar2 + 4;
    }
    free(local_1f0.mem_);
    free(local_1e0.mem_);
  }
  return;
}

Assistant:

void kernel_upcast16to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int16_t);

  AlignedVector<int16_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int16_t>(-LENGTH / 2));

  auto result = kernels::upcast16to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}